

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O0

void RemoveChild(nodetree *p,nodetree *Child)

{
  nodetree **local_20;
  nodetree **i;
  nodetree *Child_local;
  nodetree *p_local;
  
  local_20 = &p->Children;
  do {
    if (*local_20 == (nodetree *)0x0) {
LAB_0012cdc3:
      Child->Next = (nodetree *)0x0;
      Child->Parent = (nodetree *)0x0;
      return;
    }
    if (*local_20 == Child) {
      *local_20 = Child->Next;
      goto LAB_0012cdc3;
    }
    local_20 = &(*local_20)->Next;
  } while( true );
}

Assistant:

static void RemoveChild(nodetree* p,nodetree* Child)
{
	nodetree** i;

	for (i=&p->Children;*i;i=&(*i)->Next)
		if (*i==Child)
		{
			*i=Child->Next;
			break;
		}

	Child->Next = NULL;
    Child->Parent = NULL;
}